

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int defragmentPage(MemPage *pPage,int nMaxFrag)

{
  u8 *__src;
  char *__dest;
  ushort uVar1;
  u16 uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort *puVar5;
  ushort uVar6;
  ushort uVar7;
  undefined8 uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  u8 *__src_00;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  
  __src = pPage->aData;
  uVar15 = (ulong)pPage->hdrOffset;
  uVar7 = pPage->cellOffset;
  uVar3 = pPage->nCell;
  uVar9 = (uint)uVar7 + (uint)uVar3 * 2;
  uVar10 = pPage->pBt->usableSize;
  if (nMaxFrag < (int)(uint)__src[uVar15 + 7]) {
LAB_001581d0:
    uVar12 = uVar10;
    if ((ulong)uVar3 != 0) {
      uVar6 = *(ushort *)(__src + uVar15 + 5);
      __dest = pPage->pBt->pPager->pTmpSpace;
      memcpy(__dest,__src,(long)(int)uVar10);
      uVar16 = 0;
      do {
        uVar1 = *(ushort *)(__src + uVar16 * 2 + (ulong)uVar7) << 8 |
                *(ushort *)(__src + uVar16 * 2 + (ulong)uVar7) >> 8;
        if ((int)(uVar10 - 4) < (int)(uint)uVar1) {
          uVar8 = 0x11b1e;
          goto LAB_001583ce;
        }
        __src_00 = (u8 *)(__dest + (uint)uVar1);
        uVar2 = (*pPage->xCellSize)(pPage,__src_00);
        uVar12 = uVar12 - uVar2;
        if (((int)uVar12 < (int)(uint)(ushort)(uVar6 << 8 | uVar6 >> 8)) ||
           ((int)uVar10 < (int)((uint)uVar1 + (uint)uVar2))) {
          uVar8 = 0x11b24;
          goto LAB_001583ce;
        }
        *(ushort *)(__src + uVar16 * 2 + (ulong)uVar7) = (ushort)uVar12 << 8 | (ushort)uVar12 >> 8;
        memcpy(__src + uVar12,__src_00,(ulong)uVar2);
        uVar16 = uVar16 + 1;
      } while (uVar3 != uVar16);
    }
    __src[uVar15 + 7] = '\0';
  }
  else {
    uVar6 = *(ushort *)(__src + uVar15 + 1) << 8 | *(ushort *)(__src + uVar15 + 1) >> 8;
    if ((int)(uVar10 - 4) < (int)(uint)uVar6) {
      uVar8 = 0x11ae9;
      goto LAB_001583ce;
    }
    uVar17 = (uint)uVar6;
    if (uVar6 == 0) goto LAB_001581d0;
    uVar1 = *(ushort *)(__src + uVar6) << 8 | *(ushort *)(__src + uVar6) >> 8;
    if (uVar10 - 4 < (uint)uVar1) {
      uVar8 = 0x11aec;
      goto LAB_001583ce;
    }
    if ((uVar1 != 0) && ((__src[uVar1] != '\0' || (__src[(ulong)uVar1 + 1] != '\0'))))
    goto LAB_001581d0;
    uVar3 = *(ushort *)(__src + uVar15 + 5) << 8 | *(ushort *)(__src + uVar15 + 5) >> 8;
    iVar14 = uVar17 - uVar3;
    if (uVar17 < uVar3 || iVar14 == 0) {
      uVar8 = 0x11af4;
      goto LAB_001583ce;
    }
    uVar4 = *(ushort *)(__src + (ulong)uVar6 + 2) << 8 | *(ushort *)(__src + (ulong)uVar6 + 2) >> 8;
    uVar11 = (uint)uVar4;
    uVar12 = (uint)uVar4 + (uint)uVar6;
    if (uVar1 == 0) {
      uVar13 = 0;
      if ((int)uVar10 < (int)uVar12) {
        uVar8 = 0x11afd;
        goto LAB_001583ce;
      }
    }
    else {
      if (uVar1 < uVar12) {
        uVar8 = 0x11af7;
        goto LAB_001583ce;
      }
      uVar6 = *(ushort *)(__src + (ulong)uVar1 + 2) << 8 |
              *(ushort *)(__src + (ulong)uVar1 + 2) >> 8;
      uVar13 = (uint)uVar6;
      if ((int)uVar10 < (int)((uint)uVar6 + (uint)uVar1)) {
        uVar8 = 0x11af9;
        goto LAB_001583ce;
      }
      memmove(__src + (uVar6 + uVar12),__src + uVar12,(long)(int)(uVar1 - uVar12));
      uVar11 = (uint)uVar4 + (uint)uVar6;
    }
    uVar12 = uVar11 + uVar3;
    memmove(__src + uVar12,__src + (uint)uVar3,(long)iVar14);
    if (uVar7 < uVar9) {
      puVar5 = (ushort *)(__src + uVar7);
      do {
        uVar7 = *puVar5 << 8 | *puVar5 >> 8;
        uVar10 = uVar11;
        if ((uVar7 < uVar17) || (uVar10 = uVar13, (uint)uVar7 < (uint)uVar1)) {
          uVar7 = uVar7 + (short)uVar10;
          *puVar5 = uVar7 * 0x100 | uVar7 >> 8;
        }
        puVar5 = puVar5 + 1;
      } while (puVar5 < __src + uVar9);
    }
  }
  if ((uint)__src[uVar15 + 7] + (uVar12 - uVar9) == pPage->nFree) {
    *(ushort *)(__src + uVar15 + 5) = (ushort)uVar12 << 8 | (ushort)uVar12 >> 8;
    (__src + uVar15 + 1)[0] = '\0';
    (__src + uVar15 + 1)[1] = '\0';
    memset(__src + uVar9,0,(long)(int)(uVar12 - uVar9));
    return 0;
  }
  uVar8 = 0x11b32;
LAB_001583ce:
  sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar8,
              "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
  return 0xb;
}

Assistant:

static int defragmentPage(MemPage *pPage, int nMaxFrag){
  int i;                     /* Loop counter */
  int pc;                    /* Address of the i-th cell */
  int hdr;                   /* Offset to the page header */
  int size;                  /* Size of a cell */
  int usableSize;            /* Number of usable bytes on a page */
  int cellOffset;            /* Offset to the cell pointer array */
  int cbrk;                  /* Offset to the cell content area */
  int nCell;                 /* Number of cells on the page */
  unsigned char *data;       /* The page data */
  unsigned char *temp;       /* Temp area for cell content */
  unsigned char *src;        /* Source of content */
  int iCellFirst;            /* First allowable cell index */
  int iCellLast;             /* Last possible cell index */
  int iCellStart;            /* First cell offset in input */

  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( pPage->pBt!=0 );
  assert( pPage->pBt->usableSize <= SQLITE_MAX_PAGE_SIZE );
  assert( pPage->nOverflow==0 );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  data = pPage->aData;
  hdr = pPage->hdrOffset;
  cellOffset = pPage->cellOffset;
  nCell = pPage->nCell;
  assert( nCell==get2byte(&data[hdr+3]) || CORRUPT_DB );
  iCellFirst = cellOffset + 2*nCell;
  usableSize = pPage->pBt->usableSize;

  /* This block handles pages with two or fewer free blocks and nMaxFrag
  ** or fewer fragmented bytes. In this case it is faster to move the
  ** two (or one) blocks of cells using memmove() and add the required
  ** offsets to each pointer in the cell-pointer array than it is to
  ** reconstruct the entire page.  */
  if( (int)data[hdr+7]<=nMaxFrag ){
    int iFree = get2byte(&data[hdr+1]);
    if( iFree>usableSize-4 ) return SQLITE_CORRUPT_PAGE(pPage);
    if( iFree ){
      int iFree2 = get2byte(&data[iFree]);
      if( iFree2>usableSize-4 ) return SQLITE_CORRUPT_PAGE(pPage);
      if( 0==iFree2 || (data[iFree2]==0 && data[iFree2+1]==0) ){
        u8 *pEnd = &data[cellOffset + nCell*2];
        u8 *pAddr;
        int sz2 = 0;
        int sz = get2byte(&data[iFree+2]);
        int top = get2byte(&data[hdr+5]);
        if( top>=iFree ){
          return SQLITE_CORRUPT_PAGE(pPage);
        }
        if( iFree2 ){
          if( iFree+sz>iFree2 ) return SQLITE_CORRUPT_PAGE(pPage);
          sz2 = get2byte(&data[iFree2+2]);
          if( iFree2+sz2 > usableSize ) return SQLITE_CORRUPT_PAGE(pPage);
          memmove(&data[iFree+sz+sz2], &data[iFree+sz], iFree2-(iFree+sz));
          sz += sz2;
        }else if( iFree+sz>usableSize ){
          return SQLITE_CORRUPT_PAGE(pPage);
        }

        cbrk = top+sz;
        assert( cbrk+(iFree-top) <= usableSize );
        memmove(&data[cbrk], &data[top], iFree-top);
        for(pAddr=&data[cellOffset]; pAddr<pEnd; pAddr+=2){
          pc = get2byte(pAddr);
          if( pc<iFree ){ put2byte(pAddr, pc+sz); }
          else if( pc<iFree2 ){ put2byte(pAddr, pc+sz2); }
        }
        goto defragment_out;
      }
    }
  }

  cbrk = usableSize;
  iCellLast = usableSize - 4;
  iCellStart = get2byte(&data[hdr+5]);
  if( nCell>0 ){
    temp = sqlite3PagerTempSpace(pPage->pBt->pPager);
    memcpy(temp, data, usableSize);
    src = temp;
    for(i=0; i<nCell; i++){
      u8 *pAddr;     /* The i-th cell pointer */
      pAddr = &data[cellOffset + i*2];
      pc = get2byte(pAddr);
      testcase( pc==iCellFirst );
      testcase( pc==iCellLast );
      /* These conditions have already been verified in btreeInitPage()
      ** if PRAGMA cell_size_check=ON.
      */
      if( pc>iCellLast ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      assert( pc>=0 && pc<=iCellLast );
      size = pPage->xCellSize(pPage, &src[pc]);
      cbrk -= size;
      if( cbrk<iCellStart || pc+size>usableSize ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      assert( cbrk+size<=usableSize && cbrk>=iCellStart );
      testcase( cbrk+size==usableSize );
      testcase( pc+size==usableSize );
      put2byte(pAddr, cbrk);
      memcpy(&data[cbrk], &src[pc], size);
    }
  }
  data[hdr+7] = 0;

defragment_out:
  assert( pPage->nFree>=0 );
  if( data[hdr+7]+cbrk-iCellFirst!=pPage->nFree ){
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  assert( cbrk>=iCellFirst );
  put2byte(&data[hdr+5], cbrk);
  data[hdr+1] = 0;
  data[hdr+2] = 0;
  memset(&data[iCellFirst], 0, cbrk-iCellFirst);
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  return SQLITE_OK;
}